

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# happly.h
# Opt level: O2

void __thiscall happly::TypedProperty<short>::readNext(TypedProperty<short> *this,istream *stream)

{
  geometrycentral::surface::std::vector<short,_std::allocator<short>_>::emplace_back<>(&this->data);
  std::istream::read((char *)stream,
                     (long)((this->data).super__Vector_base<short,_std::allocator<short>_>._M_impl.
                            super__Vector_impl_data._M_finish + -1));
  return;
}

Assistant:

virtual void readNext(std::istream& stream) override {
    data.emplace_back();
    stream.read((char*)&data.back(), sizeof(T));
  }